

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O1

Dec_Graph_t * Abc_ManResubQuit1(Abc_Obj_t *pRoot,Abc_Obj_t *pObj0,Abc_Obj_t *pObj1,int fOrGate)

{
  Dec_Edge_t DVar1;
  Dec_Graph_t *pDVar2;
  Dec_Node_t *pDVar3;
  uint uVar4;
  uint uVar5;
  
  if (pObj0 == pObj1) {
    __assert_fail("pObj0 != pObj1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                  ,0x28d,
                  "Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if (((ulong)pObj0 & 1) == 0) {
    if (((ulong)pObj1 & 1) == 0) {
      pDVar2 = (Dec_Graph_t *)malloc(0x20);
      pDVar2->fConst = 0;
      pDVar2->nLeaves = 0;
      pDVar2->nSize = 0;
      pDVar2->nCap = 0;
      pDVar2->pNodes = (Dec_Node_t *)0x0;
      *(undefined8 *)&pDVar2->eRoot = 0;
      pDVar2->nLeaves = 2;
      pDVar2->nSize = 2;
      pDVar2->nCap = 0x36;
      pDVar3 = (Dec_Node_t *)malloc(0x510);
      pDVar2->pNodes = pDVar3;
      pDVar3->eEdge0 = (Dec_Edge_t)0x0;
      pDVar3->eEdge1 = (Dec_Edge_t)0x0;
      (pDVar3->field_2).pFunc = (void *)0x0;
      pDVar3[1].field_2.pFunc = (void *)0x0;
      *(undefined8 *)&pDVar3[1].field_0x10 = 0;
      *(undefined8 *)&pDVar3->field_0x10 = 0;
      pDVar3[1].eEdge0 = (Dec_Edge_t)0x0;
      pDVar3[1].eEdge1 = (Dec_Edge_t)0x0;
      (pDVar3->field_2).pFunc = pObj0;
      pDVar3[1].field_2.pFunc = pObj1;
      DVar1 = (Dec_Edge_t)(*(uint *)&pObj0->field_0x14 >> 7 & 1);
      uVar4 = *(uint *)&pObj1->field_0x14 >> 7 & 1;
      uVar5 = uVar4 << 0x10 | (int)DVar1 << 0xf;
      pDVar3 = pDVar2->pNodes;
      pDVar2->nSize = 3;
      pDVar3[2].eEdge0 = (Dec_Edge_t)0x0;
      pDVar3[2].eEdge1 = (Dec_Edge_t)0x0;
      pDVar3[2].field_2.pFunc = (void *)0x0;
      *(undefined8 *)&pDVar3[2].field_0x10 = 0;
      pDVar3[2].eEdge0 = DVar1;
      pDVar3[2].eEdge1 = (Dec_Edge_t)(uVar4 + 2);
      if (fOrGate == 0) {
        *(uint *)&pDVar3[2].field_0x10 = uVar5;
        DVar1 = (Dec_Edge_t)0x4;
      }
      else {
        *(uint *)&pDVar3[2].field_0x10 = uVar5 | 0x4000;
        pDVar3[2].eEdge0 = (Dec_Edge_t)((uint)DVar1 ^ 1);
        pDVar3[2].eEdge1 = (Dec_Edge_t)(uVar4 ^ 3);
        DVar1 = (Dec_Edge_t)0x5;
      }
      pDVar2->eRoot = DVar1;
      if ((pRoot->field_0x14 & 0x80) != 0) {
        pDVar2->eRoot = (Dec_Edge_t)((uint)DVar1 ^ 1);
      }
      return pDVar2;
    }
    __assert_fail("!Abc_ObjIsComplement(pObj1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                  ,0x28f,
                  "Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  __assert_fail("!Abc_ObjIsComplement(pObj0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                ,0x28e,"Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)")
  ;
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit1( Abc_Obj_t * pRoot, Abc_Obj_t * pObj0, Abc_Obj_t * pObj1, int fOrGate )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot, eNode0, eNode1;
    assert( pObj0 != pObj1 );
    assert( !Abc_ObjIsComplement(pObj0) );
    assert( !Abc_ObjIsComplement(pObj1) );
    pGraph = Dec_GraphCreate( 2 );
    Dec_GraphNode( pGraph, 0 )->pFunc = pObj0;
    Dec_GraphNode( pGraph, 1 )->pFunc = pObj1;
    eNode0 = Dec_EdgeCreate( 0, pObj0->fPhase );
    eNode1 = Dec_EdgeCreate( 1, pObj1->fPhase );
    if ( fOrGate ) 
        eRoot  = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    else
        eRoot  = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}